

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall notch::core::ActivationLayer::outputInplace(ActivationLayer *this,Array *inputs)

{
  valarray<float> *this_00;
  float *__first;
  float *__result;
  float *__last;
  
  this_00 = (this->super_ABackpropLayer).shared.outputBuffer.
            super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_M_size != this->nSize) {
    std::valarray<float>::resize(this_00,this->nSize,0.0);
  }
  std::valarray<float>::operator=
            ((this->super_ABackpropLayer).shared.inputBuffer.
             super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,inputs);
  __first = inputs->_M_data;
  __last = __first + inputs->_M_size;
  if (inputs->_M_size == 0) {
    __last = (float *)0x0;
    __first = (float *)0x0;
  }
  __result = (float *)this_00->_M_size;
  if (__result != (float *)0x0) {
    __result = this_00->_M_data;
  }
  ::std::
  transform<float_const*,float*,notch::core::ActivationLayer::outputInplace(std::valarray<float>const&)::_lambda(float)_1_>
            (__first,__last,__result,this->activationFunction);
  return;
}

Assistant:

virtual void outputInplace(const Array &inputs) {
        Array &outputs = *shared.outputBuffer;
        if (outputs.size() != nSize) {
            outputs.resize(nSize);
        }
        *shared.inputBuffer = inputs;
        auto &activation = (*activationFunction);
        std::transform(
            std::begin(inputs), std::end(inputs),
            std::begin(outputs),
            [&](float y) { return activation(y); });
    }